

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::PropertyReferenceWalk_Impl<false>
               (Var instance,RecyclableObject **propertyObject,PropertyId propertyId,Var *value,
               PropertyValueInfo *info,ScriptContext *requestContext)

{
  BOOL BVar1;
  PropertyQueryFlags val;
  RecyclableObject *pRStack_48;
  PropertyQueryFlags result;
  RecyclableObject *object;
  BOOL foundProperty;
  ScriptContext *requestContext_local;
  PropertyValueInfo *info_local;
  Var *value_local;
  PropertyId propertyId_local;
  RecyclableObject **propertyObject_local;
  Var instance_local;
  
  object._4_4_ = 0;
  pRStack_48 = *propertyObject;
  do {
    BVar1 = IsNull(pRStack_48);
    if (BVar1 != 0) {
LAB_00fb207e:
      *propertyObject = pRStack_48;
      return object._4_4_;
    }
    val = (*(pRStack_48->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x16])
                    (pRStack_48,instance,(ulong)(uint)propertyId,value,info,requestContext);
    if (val != Property_NotFound) {
      object._4_4_ = JavascriptConversion::PropertyQueryFlagsToBoolean(val);
      goto LAB_00fb207e;
    }
    BVar1 = RecyclableObject::SkipsPrototype(pRStack_48);
    if (BVar1 != 0) goto LAB_00fb207e;
    pRStack_48 = GetPrototypeNoTrap(pRStack_48);
  } while( true );
}

Assistant:

BOOL JavascriptOperators::PropertyReferenceWalk_Impl(Var instance, RecyclableObject** propertyObject, PropertyId propertyId, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        BOOL foundProperty = false;
        RecyclableObject* object = *propertyObject;
        while (!foundProperty && !JavascriptOperators::IsNull(object))
        {
            if (unscopables && JavascriptOperators::IsPropertyUnscopable(object, propertyId))
            {
                break;
            }
            else
            {
                PropertyQueryFlags result = object->GetPropertyReferenceQuery(instance, propertyId, value, info, requestContext);
                if (result != PropertyQueryFlags::Property_NotFound)
                {
                    foundProperty = JavascriptConversion::PropertyQueryFlagsToBoolean(result);
                    break;
                }
            }

            if (object->SkipsPrototype())
            {
                break; // will return false
            }

            object = JavascriptOperators::GetPrototypeNoTrap(object);

        }
        *propertyObject = object;
        return foundProperty;
    }